

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

void Curl_flush_cookies(Curl_easy *data,_Bool cleanup)

{
  CookieInfo *pCVar1;
  curl_trc_feat *pcVar2;
  bool bVar3;
  uint uVar4;
  CURLcode error;
  int iVar5;
  void *__base;
  Curl_llist_node *n;
  void *pvVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  undefined7 in_register_00000031;
  long lVar10;
  ulong uVar11;
  byte *filename;
  char cVar12;
  undefined8 unaff_R15;
  size_t __nmemb;
  FILE *out;
  FILE *local_50;
  char *local_48;
  uint local_40;
  undefined4 local_3c;
  byte *local_38;
  
  pcVar8 = (data->set).str[0x1b];
  Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
  if (pcVar8 == (char *)0x0) goto LAB_0011f8b2;
  pCVar1 = data->cookies;
  filename = (byte *)(data->set).str[0x1b];
  local_50 = (FILE *)0x0;
  local_48 = (char *)0x0;
  if (pCVar1 == (CookieInfo *)0x0) goto LAB_0011f8b2;
  remove_expired(pCVar1);
  uVar4 = *filename - 0x2d;
  if (uVar4 == 0) {
    uVar4 = (uint)filename[1];
  }
  if (uVar4 == 0) {
    local_50 = _stdout;
    uVar7 = CONCAT71((int7)((ulong)unaff_R15 >> 8),1);
LAB_0011f6b6:
    fputs("# Netscape HTTP Cookie File\n# https://curl.se/docs/http-cookies.html\n# This file was generated by libcurl! Edit at your own risk.\n\n"
          ,local_50);
    if ((ulong)pCVar1->numcookies != 0) {
      __base = (*Curl_ccalloc)(1,(ulong)pCVar1->numcookies << 3);
      if (__base == (void *)0x0) {
LAB_0011f837:
        cVar12 = (char)uVar7;
        error = CURLE_OUT_OF_MEMORY;
        goto LAB_0011f83d;
      }
      local_40 = (uint)uVar7;
      local_3c = (undefined4)CONCAT71(in_register_00000031,cleanup);
      lVar10 = 0;
      __nmemb = 0;
      local_38 = filename;
      do {
        for (n = Curl_llist_head(pCVar1->cookielist + lVar10); n != (Curl_llist_node *)0x0;
            n = Curl_node_next(n)) {
          pvVar6 = Curl_node_elem(n);
          if (*(long *)((long)pvVar6 + 0x60) != 0) {
            *(void **)((long)__base + __nmemb * 8) = pvVar6;
            __nmemb = __nmemb + 1;
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x3f);
      qsort(__base,__nmemb,8,cookie_sort_ct);
      if (__nmemb != 0) {
        uVar7 = 0;
        uVar11 = 1;
        do {
          pcVar8 = get_netscape_format(*(Cookie **)((long)__base + uVar7 * 8));
          if (pcVar8 == (char *)0x0) {
            (*Curl_cfree)(__base);
            cleanup = SUB41(local_3c,0);
            uVar7 = (ulong)local_40;
            goto LAB_0011f837;
          }
          curl_mfprintf((FILE *)local_50,"%s\n",pcVar8);
          (*Curl_cfree)(pcVar8);
          bVar3 = uVar11 < __nmemb;
          uVar7 = uVar11;
          uVar11 = (ulong)((int)uVar11 + 1);
        } while (bVar3);
      }
      (*Curl_cfree)(__base);
      cleanup = SUB41(local_3c,0);
      uVar7 = (ulong)local_40;
      filename = local_38;
    }
    pcVar8 = local_48;
    if ((char)uVar7 == '\0') {
      fclose(local_50);
      local_50 = (FILE *)0x0;
      if (local_48 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        iVar5 = Curl_rename(local_48,(char *)filename);
        pcVar8 = local_48;
        if (iVar5 != 0) {
          unlink(local_48);
          error = CURLE_WRITE_ERROR;
          cVar12 = '\0';
          goto LAB_0011f83d;
        }
      }
    }
    (*Curl_cfree)(pcVar8);
  }
  else {
    error = Curl_fopen(data,(char *)filename,(FILE **)&local_50,&local_48);
    if (error == CURLE_OK) {
      uVar7 = 0;
      goto LAB_0011f6b6;
    }
    cVar12 = '\0';
LAB_0011f83d:
    if ((local_50 != (FILE *)0x0) && (cVar12 == '\0')) {
      fclose(local_50);
    }
    (*Curl_cfree)(local_48);
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
       ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
      pcVar8 = (data->set).str[0x1b];
      pcVar9 = curl_easy_strerror(error);
      Curl_infof(data,"WARNING: failed to save cookies in %s: %s",pcVar8,pcVar9);
    }
  }
LAB_0011f8b2:
  if (cleanup != false) {
    pCVar1 = data->cookies;
    if ((data->share == (Curl_share *)0x0) || (pCVar1 != data->share->cookies)) {
      if (pCVar1 != (CookieInfo *)0x0) {
        Curl_cookie_clearall(pCVar1);
        (*Curl_cfree)(pCVar1);
      }
      data->cookies = (CookieInfo *)0x0;
    }
  }
  Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
  return;
}

Assistant:

void Curl_flush_cookies(struct Curl_easy *data, bool cleanup)
{
  CURLcode res;

  if(data->set.str[STRING_COOKIEJAR]) {
    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);

    /* if we have a destination file for all the cookies to get dumped to */
    res = cookie_output(data, data->cookies, data->set.str[STRING_COOKIEJAR]);
    if(res)
      infof(data, "WARNING: failed to save cookies in %s: %s",
            data->set.str[STRING_COOKIEJAR], curl_easy_strerror(res));
  }
  else {
    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
  }

  if(cleanup && (!data->share || (data->cookies != data->share->cookies))) {
    Curl_cookie_cleanup(data->cookies);
    data->cookies = NULL;
  }
  Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
}